

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O2

Error asmjit::X86RAPass_translateOperands(X86RAPass *self,Operand_ *opArray,uint32_t opCount)

{
  int iVar1;
  CodeBuilder *pCVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  VirtReg *vreg;
  uint uVar6;
  uint *in_RAX;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  pCVar2 = (self->super_RAPass).super_CBPass._cb;
  lVar9 = 0;
  lVar10 = 0;
  do {
    if ((ulong)opCount << 4 == lVar9) {
      return (Error)in_RAX;
    }
    uVar6 = *(uint *)((long)&opArray->field_0 + lVar9);
    in_RAX = (uint *)(ulong)uVar6;
    if ((uVar6 & 7) == 2) {
      if (8 < (uVar6 & 0xf8)) {
        iVar1 = *(int *)((long)&opArray->field_0 + lVar9 + 0xc);
        uVar8 = (ulong)(iVar1 - 0x100);
        uVar5._0_4_ = pCVar2[1].super_CodeEmitter._privateData;
        uVar5._4_4_ = pCVar2[1].super_CodeEmitter._globalHints;
        if (uVar8 < uVar5) {
          if (iVar1 == -1) goto LAB_0016bbea;
          vreg = *(VirtReg **)(*(long *)&pCVar2[1].super_CodeEmitter._type + uVar8 * 8);
          if ((uVar6 >> 0x10 & 1) == 0) {
            if (vreg->_physId == 0xff) {
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/x86/x86regalloc.cpp"
                         ,0xe3e,"vreg->getPhysId() != Globals::kInvalidRegId");
            }
            *(uint *)((long)&opArray->field_0 + lVar9 + 0xc) = (uint)vreg->_physId;
          }
          else if (vreg->_memCell == (RACell *)0x0) {
            RAPass::_newVarCell(&self->super_RAPass,vreg);
            uVar6 = *(uint *)((long)&opArray->field_0 + lVar9);
          }
        }
      }
      in_RAX = (uint *)(ulong)(uVar6 & 0x1f00);
      if (0x100 < (uVar6 & 0x1f00)) {
        uVar6 = *(uint *)((long)&opArray->field_0 + lVar9 + 4);
        in_RAX = (uint *)(ulong)uVar6;
        uVar8._0_4_ = pCVar2[1].super_CodeEmitter._privateData;
        uVar8._4_4_ = pCVar2[1].super_CodeEmitter._globalHints;
        if (uVar6 - 0x100 < uVar8) {
          if (uVar6 == 0xffffffff) goto LAB_0016bbea;
          in_RAX = (uint *)((long)&opArray->field_0 + lVar9 + 4);
          bVar7 = *(byte *)(*(long *)(*(long *)&pCVar2[1].super_CodeEmitter._type +
                                     (ulong)(uVar6 - 0x100) * 8) + 0x25);
          goto LAB_0016bbca;
        }
      }
    }
    else if ((uVar6 & 7) == 1) {
      uVar6 = *(uint *)((long)&opArray->field_0 + lVar9 + 4);
      in_RAX = (uint *)(ulong)uVar6;
      if (0xff < uVar6) {
        if (uVar6 == 0xffffffff) {
LAB_0016bbea:
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/x86/../x86/../base/codecompiler.h"
                     ,0x2a6,"id != kInvalidValue");
        }
        uVar3._0_4_ = pCVar2[1].super_CodeEmitter._privateData;
        uVar3._4_4_ = pCVar2[1].super_CodeEmitter._globalHints;
        if (uVar3 <= uVar6 - 0x100) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/x86/../x86/../base/codecompiler.h"
                     ,0x2a9,"index < _vRegArray.getLength()");
        }
        lVar4 = *(long *)(*(long *)&pCVar2[1].super_CodeEmitter._type + (ulong)(uVar6 - 0x100) * 8);
        if (lVar4 == 0) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/x86/x86regalloc.cpp"
                     ,0xe30,"vreg != nullptr");
        }
        bVar7 = *(byte *)(lVar4 + 0x25);
        if (bVar7 == 0xff) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/x86/x86regalloc.cpp"
                     ,0xe31,"vreg->getPhysId() != Globals::kInvalidRegId");
        }
        in_RAX = &opArray[lVar10].field_0._signature + 1;
LAB_0016bbca:
        *in_RAX = (uint)bVar7;
      }
    }
    lVar10 = lVar10 + 1;
    lVar9 = lVar9 + 0x10;
  } while( true );
}

Assistant:

static Error X86RAPass_translateOperands(X86RAPass* self, Operand_* opArray, uint32_t opCount) {
  X86Compiler* cc = self->cc();

  // Translate variables into registers.
  for (uint32_t i = 0; i < opCount; i++) {
    Operand_* op = &opArray[i];
    if (op->isVirtReg()) {
      VirtReg* vreg = cc->getVirtRegById(op->getId());
      ASMJIT_ASSERT(vreg != nullptr);
      ASMJIT_ASSERT(vreg->getPhysId() != Globals::kInvalidRegId);
      op->_reg.id = vreg->getPhysId();
    }
    else if (op->isMem()) {
      X86Mem* m = static_cast<X86Mem*>(op);

      if (m->hasBaseReg() && cc->isVirtRegValid(m->getBaseId())) {
        VirtReg* vreg = cc->getVirtRegById(m->getBaseId());

        if (m->isRegHome()) {
          self->getVarCell(vreg);
        }
        else {
          ASMJIT_ASSERT(vreg->getPhysId() != Globals::kInvalidRegId);
          op->_mem.base = vreg->getPhysId();
        }
      }

      if (m->hasIndexReg() && cc->isVirtRegValid(m->getIndexId())) {
        VirtReg* vreg = cc->getVirtRegById(m->getIndexId());
        op->_mem.index = vreg->getPhysId();
      }
    }
  }

  return kErrorOk;
}